

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_utl.cc
# Opt level: O0

int asn1_enc_restore(int *len,uchar **out,ASN1_VALUE **pval,ASN1_ITEM *it)

{
  ASN1_ENCODING *pAVar1;
  ASN1_ENCODING *enc;
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  uchar **out_local;
  int *len_local;
  
  pAVar1 = asn1_get_enc_ptr((ASN1_VALUE **)pval,(ASN1_ITEM *)it);
  if ((pAVar1 == (ASN1_ENCODING *)0x0) || (pAVar1->len == 0)) {
    len_local._4_4_ = 0;
  }
  else {
    if (out != (uchar **)0x0) {
      OPENSSL_memcpy(*out,pAVar1->enc,pAVar1->len);
      *out = *out + pAVar1->len;
    }
    if (len != (int *)0x0) {
      *len = (int)pAVar1->len;
    }
    len_local._4_4_ = 1;
  }
  return len_local._4_4_;
}

Assistant:

int asn1_enc_restore(int *len, unsigned char **out, ASN1_VALUE **pval,
                     const ASN1_ITEM *it) {
  ASN1_ENCODING *enc = asn1_get_enc_ptr(pval, it);
  if (!enc || enc->len == 0) {
    return 0;
  }
  if (out) {
    OPENSSL_memcpy(*out, enc->enc, enc->len);
    *out += enc->len;
  }
  if (len) {
    *len = enc->len;
  }
  return 1;
}